

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

void vkt::tessellation::getClampedRoundedQuadTessLevels
               (SpacingMode spacingMode,float *innerSrc,float *outerSrc,int *innerDst,int *outerDst)

{
  int iVar1;
  int i;
  long lVar2;
  int i_1;
  
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    iVar1 = getClampedRoundedTessLevel(spacingMode,innerSrc[lVar2]);
    innerDst[lVar2] = iVar1;
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar1 = getClampedRoundedTessLevel(spacingMode,outerSrc[lVar2]);
    outerDst[lVar2] = iVar1;
  }
  return;
}

Assistant:

void getClampedRoundedQuadTessLevels (const SpacingMode spacingMode,
									  const float*		innerSrc,
									  const float*		outerSrc,
									  int*				innerDst,
									  int*				outerDst)
{
	for (int i = 0; i < 2; i++)
		innerDst[i] = getClampedRoundedTessLevel(spacingMode, innerSrc[i]);
	for (int i = 0; i < 4; i++)
		outerDst[i] = getClampedRoundedTessLevel(spacingMode, outerSrc[i]);
}